

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execShiftRg<(moira::Core)2,(moira::Instr)94,(moira::Mode)0,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  this->cp = 0;
  uVar5 = *(uint *)((long)&(this->reg).field_3 + (ulong)(opcode >> 9 & 7) * 4);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  this->readBuffer = (u16)uVar1;
  iVar2 = *(int *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  uVar5 = uVar5 & 0x3f;
  uVar4 = uVar5;
  if (uVar5 == 0) {
    iVar3 = 0;
  }
  else {
    do {
      iVar3 = -(iVar2 >> 0x1f);
      iVar2 = iVar3 + iVar2 * 2;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  (this->reg).sr.c = SUB41(iVar3,0);
  (this->reg).sr.v = false;
  (this->reg).sr.n = SUB41((uint)iVar2 >> 0x1f,0);
  (this->reg).sr.z = iVar2 == 0;
  *(int *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4) = iVar2;
  (*this->_vptr_Moira[2])(this,(ulong)(uVar5 + 8 + this->cp));
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    int cnt = readD(src) & 0x3F;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(  8 + cnt );
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES( 12 + cnt );
                break;
                
            default:
                
                CYCLES(  6 + cnt );
                break;
        }
    }

    FINALIZE
}